

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<DomProperty_*>::growAppend
          (QCommonArrayOps<DomProperty_*> *this,DomProperty **b,DomProperty **e)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<DomProperty_*> *old_00;
  DomProperty **in_RDX;
  DomProperty **in_RSI;
  QPodArrayOps<DomProperty_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<DomProperty_*> *c;
  GrowthPosition where;
  QArrayDataPointer<DomProperty_*> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<DomProperty_*> *)((long)in_RDX - (long)in_RSI >> 3);
    c = (QCommonArrayOps<DomProperty_*> *)0xaaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<DomProperty_*> *)0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<DomProperty_*>::QArrayDataPointer
              ((QArrayDataPointer<DomProperty_*> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<DomProperty*>,DomProperty*const*>
                      ((DomProperty ***)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<DomProperty_*>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(DomProperty ***)in_RDX,old_00);
    }
    else {
      QArrayDataPointer<DomProperty_*>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(DomProperty ***)in_RDX,old_00);
    }
    QPodArrayOps<DomProperty_*>::copyAppend(in_RDI,in_RDX,(DomProperty **)old_00);
    QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }